

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

ShaderSourceFileData *
Diligent::ReadShaderSourceFile
          (ShaderSourceFileData *__return_storage_ptr__,char *SourceCode,size_t SourceLength,
          IShaderSourceInputStreamFactory *pShaderSourceStreamFactory,char *FilePath)

{
  IDataBlob *pIVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string msg;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  string local_48;
  long *local_28;
  char *local_20;
  
  (__return_storage_ptr__->pFileData).m_pObject = (IDataBlob *)0x0;
  __return_storage_ptr__->Source = (char *)0x0;
  __return_storage_ptr__->SourceLength = 0;
  local_20 = FilePath;
  if (SourceCode == (char *)0x0) {
    if (pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
      FormatString<char[29]>(&local_48,(char (*) [29])"Input stream factory is null");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0x101);
    }
    else {
      if (FilePath != (char *)0x0) {
        local_48._M_string_length = (size_type)&stack0xffffffffffffffd8;
        local_28 = (long *)0x0;
        local_48._M_dataplus._M_p = (pointer)0x0;
        (*(pShaderSourceStreamFactory->super_IObject)._vptr_IObject[4])(pShaderSourceStreamFactory);
        RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::
        ~DoublePtrHelper((DoublePtrHelper<Diligent::IFileStream> *)&local_48);
        if (local_28 == (long *)0x0) {
          local_48._M_dataplus._M_p._0_1_ = 0x27;
          LogError<true,char[36],char_const*,char>
                    (false,"ReadShaderSourceFile",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                     ,0xf3,(char (*) [36])"Failed to load shader source file \'",
                     &stack0xffffffffffffffe0,(char *)&local_48);
        }
        DataBlobImpl::Create((DataBlobImpl *)&local_48,0,(void *)0x0);
        RefCntAutoPtr<Diligent::IDataBlob>::operator=
                  (&__return_storage_ptr__->pFileData,
                   (RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_48);
        RefCntAutoPtr<Diligent::DataBlobImpl>::Release
                  ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&local_48);
        (**(code **)(*local_28 + 0x28))(local_28,(__return_storage_ptr__->pFileData).m_pObject);
        pIVar1 = (__return_storage_ptr__->pFileData).m_pObject;
        iVar3 = (*(pIVar1->super_IObject)._vptr_IObject[7])(pIVar1,0);
        __return_storage_ptr__->Source = (char *)CONCAT44(extraout_var,iVar3);
        iVar3 = (*(((__return_storage_ptr__->pFileData).m_pObject)->super_IObject)._vptr_IObject[5])
                          ();
        local_48._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
        uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_48);
        __return_storage_ptr__->SourceLength = uVar2;
        if (local_28 == (long *)0x0) {
          return __return_storage_ptr__;
        }
        (**(code **)(*local_28 + 0x10))();
        return __return_storage_ptr__;
      }
      FormatString<char[17]>(&local_48,(char (*) [17])"FilePath is null");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xfc);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (FilePath != (char *)0x0) {
      FormatString<char[50]>
                (&local_48,(char (*) [50])"FilePath must be null when SourceCode is not null");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xe6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    __return_storage_ptr__->Source = SourceCode;
    if (SourceLength == 0) {
      SourceLength = strlen(SourceCode);
    }
    local_48._M_dataplus._M_p = (pointer)SourceLength;
    uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_48);
    __return_storage_ptr__->SourceLength = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderSourceFileData ReadShaderSourceFile(const char*                      SourceCode,
                                          size_t                           SourceLength,
                                          IShaderSourceInputStreamFactory* pShaderSourceStreamFactory,
                                          const char*                      FilePath) noexcept(false)
{
    ShaderSourceFileData SourceData;
    if (SourceCode != nullptr)
    {
        VERIFY(FilePath == nullptr, "FilePath must be null when SourceCode is not null");
        SourceData.Source       = SourceCode;
        SourceData.SourceLength = StaticCast<Uint32>(SourceLength != 0 ? SourceLength : strlen(SourceCode));
    }
    else
    {
        if (pShaderSourceStreamFactory != nullptr)
        {
            if (FilePath != nullptr)
            {
                RefCntAutoPtr<IFileStream> pSourceStream;
                pShaderSourceStreamFactory->CreateInputStream(FilePath, &pSourceStream);
                if (pSourceStream == nullptr)
                    LOG_ERROR_AND_THROW("Failed to load shader source file '", FilePath, '\'');

                SourceData.pFileData = DataBlobImpl::Create();
                pSourceStream->ReadBlob(SourceData.pFileData);
                SourceData.Source       = SourceData.pFileData->GetConstDataPtr<char>();
                SourceData.SourceLength = StaticCast<Uint32>(SourceData.pFileData->GetSize());
            }
            else
            {
                UNEXPECTED("FilePath is null");
            }
        }
        else
        {
            UNEXPECTED("Input stream factory is null");
        }
    }

    return SourceData;
}